

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

bool __thiscall
DisasmReplayer::enqueue_create_shader_module
          (DisasmReplayer *this,Hash hash,VkShaderModuleCreateInfo *create_info,
          VkShaderModule *module)

{
  PFN_vkCreateShaderModule p_Var1;
  bool bVar2;
  VkResult VVar3;
  VkShaderModule_T *pVVar4;
  VkDevice pVVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  VkShaderModule *module_local;
  VkShaderModuleCreateInfo *create_info_local;
  Hash hash_local;
  DisasmReplayer *this_local;
  
  module_local = (VkShaderModule *)create_info;
  create_info_local = (VkShaderModuleCreateInfo *)hash;
  hash_local = (Hash)this;
  bVar2 = shader_module_is_active(this,hash);
  if (bVar2) {
    if (this->device == (VulkanDevice *)0x0) {
      pVVar4 = fake_handle<VkShaderModule_T*>((uint64_t)create_info_local);
      *module = pVVar4;
    }
    else {
      fprintf(_stderr,"Fossilize INFO: Creating shader module 0%lX\n",create_info_local);
      fflush(_stderr);
      p_Var1 = vkCreateShaderModule;
      pVVar5 = Fossilize::VulkanDevice::get_device(this->device);
      VVar3 = (*p_Var1)(pVVar5,(VkShaderModuleCreateInfo *)module_local,(VkAllocationCallbacks *)0x0
                        ,module);
      if (VVar3 != VK_SUCCESS) {
        fprintf(_stderr,"Fossilize ERROR:  ... Failed!\n");
        fflush(_stderr);
        return false;
      }
      fprintf(_stderr,"Fossilize INFO:  ... Succeeded!\n");
      fflush(_stderr);
    }
    sVar6 = std::vector<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>::size
                      (&this->shader_modules);
    pmVar7 = std::
             unordered_map<VkShaderModule_T_*,_unsigned_int,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>_>
             ::operator[](&this->module_to_index,module);
    *pmVar7 = (mapped_type)sVar6;
    std::vector<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>::push_back
              (&this->shader_modules,module);
    std::vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
    ::push_back(&this->shader_module_infos,(value_type *)&module_local);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->module_hashes,(value_type *)&create_info_local);
  }
  else {
    pVVar4 = fake_handle<VkShaderModule_T*>((uint64_t)create_info_local);
    *module = pVVar4;
  }
  return true;
}

Assistant:

bool enqueue_create_shader_module(Hash hash, const VkShaderModuleCreateInfo *create_info, VkShaderModule *module) override
	{
		if (!shader_module_is_active(hash))
		{
			*module = fake_handle<VkShaderModule>(hash);
			return true;
		}

		if (device)
		{
			LOGI("Creating shader module 0%" PRIX64 "\n", hash);
			if (vkCreateShaderModule(device->get_device(), create_info, nullptr, module) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*module = fake_handle<VkShaderModule>(hash);

		module_to_index[*module] = shader_modules.size();
		shader_modules.push_back(*module);
		shader_module_infos.push_back(create_info);
		module_hashes.push_back(hash);
		return true;
	}